

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

ActionResult __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckAction(ScriptValidator *this,Action *action)

{
  InvokeAction *pIVar1;
  Module *pMVar2;
  Export *pEVar3;
  Func *pFVar4;
  ulong uVar5;
  GetAction *pGVar6;
  Global *pGVar7;
  char *pcVar8;
  size_t i;
  ulong uVar9;
  long lVar10;
  anon_union_8_2_516a9242_for_ActionResult_2 aVar11;
  ActionResult AVar12;
  
  if (*(int *)(action + 0x90) == 1) {
    pGVar6 = cast<wabt::GetAction,wabt::Action>(action);
    pMVar2 = Script::GetModule(this->script_,(Var *)(pGVar6 + 0x28));
    if (pMVar2 == (Module *)0x0) {
      PrintError(this,(Location *)(pGVar6 + 8),"unknown module");
    }
    else {
      pEVar3 = Module::GetExport(pMVar2,*(string_view *)(pGVar6 + 0x70));
      if (pEVar3 == (Export *)0x0) {
        PrintError(this,(Location *)(pGVar6 + 8),"unknown global export \"%s\"",
                   *(undefined8 *)(pGVar6 + 0x70));
      }
      else {
        pGVar7 = Module::GetGlobal(pMVar2,&pEVar3->var);
        if (pGVar7 != (Global *)0x0) {
          aVar11._4_4_ = 0;
          aVar11.type.enum_ = (Type)(Type)(pGVar7->type).enum_;
          uVar5 = 2;
          goto LAB_00176940;
        }
      }
    }
  }
  else if (*(int *)(action + 0x90) == 0) {
    pIVar1 = cast<wabt::InvokeAction,wabt::Action>(action);
    pMVar2 = Script::GetModule(this->script_,(Var *)(pIVar1 + 0x28));
    if (pMVar2 == (Module *)0x0) {
      aVar11.types = (TypeVector *)0x0;
      PrintError(this,(Location *)(pIVar1 + 8),"unknown module");
    }
    else {
      pEVar3 = Module::GetExport(pMVar2,*(string_view *)(pIVar1 + 0x70));
      if (pEVar3 == (Export *)0x0) {
        aVar11.types = (TypeVector *)0x0;
        PrintError(this,(Location *)(pIVar1 + 8),"unknown function export \"%s\"",
                   *(undefined8 *)(pIVar1 + 0x70));
      }
      else {
        pFVar4 = Module::GetFunc(pMVar2,&pEVar3->var);
        if (pFVar4 == (Func *)0x0) {
          aVar11.types = (TypeVector *)0x0;
        }
        else {
          uVar5 = (*(long *)(pIVar1 + 0xa0) - *(long *)(pIVar1 + 0x98)) / 0x48;
          uVar9 = (ulong)((long)(pFVar4->decl).sig.param_types.
                                super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(pFVar4->decl).sig.param_types.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
          if (uVar5 == uVar9) {
            lVar10 = 0;
            for (uVar9 = 0; uVar5 != uVar9; uVar9 = uVar9 + 1) {
              CheckTypeIndex(this,(Location *)(*(long *)(pIVar1 + 0x98) + lVar10),
                             (Type)*(Enum *)(*(long *)(pIVar1 + 0x98) + 0x20 + lVar10),
                             (Type)(pFVar4->decl).sig.param_types.
                                   super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar9 & 0xffffffff].
                                   enum_,"invoke",(Index)uVar9,"argument");
              lVar10 = lVar10 + 0x48;
            }
            aVar11.types = &(pFVar4->decl).sig.result_types;
          }
          else {
            pcVar8 = "few";
            if (uVar9 < uVar5) {
              pcVar8 = "many";
            }
            aVar11.types = (TypeVector *)0x0;
            PrintError(this,(Location *)(pIVar1 + 8),
                       "too %s parameters to function. got %zd, expected %zd",pcVar8,uVar5);
          }
        }
      }
    }
    uVar5 = (ulong)(aVar11.types != (TypeVector *)0x0);
    goto LAB_00176940;
  }
  uVar5 = 0;
  aVar11.types = (TypeVector *)0x0;
LAB_00176940:
  AVar12.field_1.types = aVar11.types;
  AVar12._0_8_ = uVar5;
  return AVar12;
}

Assistant:

ScriptValidator::ActionResult ScriptValidator::CheckAction(
    const Action* action) {
  ActionResult result;
  ZeroMemory(result);

  switch (action->type()) {
    case ActionType::Invoke:
      result.types = CheckInvoke(cast<InvokeAction>(action));
      result.kind =
          result.types ? ActionResult::Kind::Types : ActionResult::Kind::Error;
      break;

    case ActionType::Get:
      if (Succeeded(CheckGet(cast<GetAction>(action), &result.type))) {
        result.kind = ActionResult::Kind::Type;
      } else {
        result.kind = ActionResult::Kind::Error;
      }
      break;
  }

  return result;
}